

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt_utils.h
# Opt level: O0

int64_t get_rd_thresh_from_best_rd(int64_t ref_best_rd,int mul_factor,int div_factor)

{
  undefined1 auVar1 [16];
  undefined8 local_28;
  int64_t rd_thresh;
  int div_factor_local;
  int mul_factor_local;
  int64_t ref_best_rd_local;
  
  rd_thresh = ref_best_rd;
  if (div_factor != 0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = SUB168(SEXT816(0x7fffffffffffffff),8);
    if (ref_best_rd <
        (long)div_factor *
        SUB168((auVar1 << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)mul_factor),0)) {
      local_28 = (ref_best_rd / (long)div_factor) * (long)mul_factor;
    }
    else {
      local_28 = 0x7fffffffffffffff;
    }
    rd_thresh = local_28;
  }
  return rd_thresh;
}

Assistant:

static inline int64_t get_rd_thresh_from_best_rd(int64_t ref_best_rd,
                                                 int mul_factor,
                                                 int div_factor) {
  int64_t rd_thresh = ref_best_rd;
  if (div_factor != 0) {
    rd_thresh = ref_best_rd < (div_factor * (INT64_MAX / mul_factor))
                    ? ((ref_best_rd / div_factor) * mul_factor)
                    : INT64_MAX;
  }
  return rd_thresh;
}